

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::getShaderSamplerOrImageType_abi_cxx11_
          (string *__return_storage_ptr__,Functional *this,ChannelType formatType,
          TextureType textureType,bool isSampler)

{
  bool bVar1;
  char *__rhs;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  char *local_30;
  char *imageTypePart;
  char *formatPart;
  ChannelType local_18;
  ChannelType CStack_14;
  bool isSampler_local;
  TextureType textureType_local;
  ChannelType formatType_local;
  
  CStack_14 = (ChannelType)this;
  formatPart._7_1_ = (byte)textureType & 1;
  local_18 = formatType;
  _textureType_local = __return_storage_ptr__;
  bVar1 = isFormatTypeUnsignedInteger(CStack_14);
  if (bVar1) {
    local_b8 = "u";
  }
  else {
    bVar1 = isFormatTypeSignedInteger(CStack_14);
    local_b8 = "";
    if (bVar1) {
      local_b8 = "i";
    }
  }
  imageTypePart = local_b8;
  if (local_18 == UNORM_BYTE_44) {
    local_c0 = "Buffer";
  }
  else {
    if (local_18 == SNORM_INT8) {
      local_c8 = "2D";
    }
    else {
      if (local_18 == UNORM_INT8) {
        local_d0 = "3D";
      }
      else {
        if (local_18 == SNORM_INT16) {
          local_d8 = "Cube";
        }
        else {
          local_d8 = (char *)0x0;
          if (local_18 == SNORM_INT32) {
            local_d8 = "2DArray";
          }
        }
        local_d0 = local_d8;
      }
      local_c8 = local_d0;
    }
    local_c0 = local_c8;
  }
  local_30 = local_c0;
  std::__cxx11::string::string((string *)&local_90);
  std::operator+(&local_70,&local_90,imageTypePart);
  __rhs = "image";
  if ((formatPart._7_1_ & 1) != 0) {
    __rhs = "sampler";
  }
  std::operator+(&local_50,&local_70,__rhs);
  std::operator+(__return_storage_ptr__,&local_50,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

static inline string getShaderSamplerOrImageType (TextureFormat::ChannelType formatType, TextureType textureType, bool isSampler)
{
	const char* const formatPart		= isFormatTypeUnsignedInteger(formatType)	? "u"
										: isFormatTypeSignedInteger(formatType)		? "i"
										: "";

	const char* const imageTypePart		= textureType == TEXTURETYPE_BUFFER		? "Buffer"
										: textureType == TEXTURETYPE_2D			? "2D"
										: textureType == TEXTURETYPE_3D			? "3D"
										: textureType == TEXTURETYPE_CUBE		? "Cube"
										: textureType == TEXTURETYPE_2D_ARRAY	? "2DArray"
										: DE_NULL;

	return string() + formatPart + (isSampler ? "sampler" : "image") + imageTypePart;
}